

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

unsigned_short __thiscall Deserializer::peek<unsigned_short>(Deserializer *this)

{
  uint local_24;
  byte *pbStack_20;
  uint i;
  uint8_t *temp_ptr;
  unsigned_short value;
  Deserializer *this_local;
  
  temp_ptr._6_2_ = 0;
  if (1 < (uint)((int)*(undefined8 *)(this + 8) - (int)*(byte **)this)) {
    pbStack_20 = *(byte **)this;
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      temp_ptr._6_2_ = temp_ptr._6_2_ | (ushort)*pbStack_20 << ((byte)(local_24 << 3) & 0x1f);
      pbStack_20 = pbStack_20 + 1;
    }
  }
  return temp_ptr._6_2_;
}

Assistant:

T peek() const {
    T value = 0;
    const uint8_t *temp_ptr = read_ptr;
    if (static_cast<unsigned>(end_ptr - temp_ptr) >= sizeof(T)) {
      for (auto i = 0u; i < sizeof(T); i++) {
        value |= static_cast<T>(*(temp_ptr++)) << static_cast<T>(8 * i);
      }
    }
    return value;
  }